

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O3

size_t __thiscall image_hash::operator()(image_hash *this,Image *img)

{
  pointer pCVar1;
  size_t sVar2;
  
  pCVar1 = (img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = std::_Hash_bytes(pCVar1,(long)(img->colorData).
                                        super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pCVar1,0xc70f6907)
  ;
  return sVar2;
}

Assistant:

std::size_t operator()(const Image& img) const {
		const char* beg = reinterpret_cast<const char*>(&*img.colorData.begin());
		const char* end = reinterpret_cast<const char*>(&*img.colorData.end());
#if __cplusplus >= 201703L
		return std::hash<std::string_view>()(std::string_view(beg, end - beg));
#else
		return std::hash<std::string>()(std::string(beg, end));
#endif
	}